

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner2.cpp
# Opt level: O1

void __thiscall xercesc_4_0::IGXMLScanner::scanCDSection(IGXMLScanner *this)

{
  ReaderMgr *this_00;
  XMLBufferMgr *this_01;
  ReaderMgr *this_02;
  SchemaValidator *this_03;
  DatatypeValidator *dV;
  XMLDocumentHandler *pXVar1;
  bool bVar2;
  bool bVar3;
  XMLCh XVar4;
  int iVar5;
  uint toFormat;
  XMLBuffer *this_04;
  StackElem *pSVar6;
  ComplexTypeInfo **ppCVar7;
  ComplexTypeInfo *pCVar8;
  UnexpectedEOFException *this_05;
  Codes toEmit;
  XMLCh *value;
  bool bVar9;
  XMLSize_t XVar10;
  XMLBufBid bbCData;
  XMLCh tmpBuf [9];
  int local_74;
  XMLCh local_48 [12];
  
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  bVar2 = ReaderMgr::skippedChar(this_00,L'[');
  if (!bVar2) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedOpenSquareBracket);
    ReaderMgr::skipPastSpaces(this_00);
    bVar2 = ReaderMgr::skippedChar(this_00,L'[');
    if (!bVar2) {
      return;
    }
  }
  this_01 = &(this->super_XMLScanner).fBufMgr;
  this_04 = XMLBufferMgr::bidOnBuffer(this_01);
  pSVar6 = ElemStack::topElement(&(this->super_XMLScanner).fElemStack);
  iVar5 = (*(((this->super_XMLScanner).fGrammar)->super_XSerializable)._vptr_XSerializable[5])();
  if (iVar5 == 1) {
    this_02 = (this->super_XMLScanner).fValidator[4].fReaderMgr;
    if (this_02->fCurReader == (XMLReader *)0x0) {
      pCVar8 = (ComplexTypeInfo *)0x0;
    }
    else {
      ppCVar7 = ValueStackOf<xercesc_4_0::ComplexTypeInfo_*>::peek
                          ((ValueStackOf<xercesc_4_0::ComplexTypeInfo_*> *)this_02);
      pCVar8 = *ppCVar7;
    }
    if (pCVar8 == (ComplexTypeInfo *)0x0) {
      local_74 = 2;
    }
    else {
      local_74 = 1;
      if ((pCVar8->fContentType & 0xfffffffdU) != 4) {
        local_74 = (uint)(pCVar8->fContentType != 0) * 2;
      }
    }
  }
  else {
    local_74 = (*(pSVar6->fThisElement->super_XSerializable)._vptr_XSerializable[6])();
  }
  bVar2 = false;
  bVar9 = false;
  do {
    XVar4 = ReaderMgr::getNextChar(this_00);
    toFormat = (uint)(ushort)XVar4;
    if (XVar4 == L'\0') {
      XMLScanner::emitError(&this->super_XMLScanner,UnterminatedCDATASection);
      this_05 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
      UnexpectedEOFException::UnexpectedEOFException
                (this_05,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner2.cpp"
                 ,0xa7e,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
      __cxa_throw(this_05,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
    }
    if (((((this->super_XMLScanner).fValidate == true) &&
         ((this->super_XMLScanner).fStandalone == true)) &&
        ((char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[toFormat] < '\0'))
       && ((local_74 == 1 && (pSVar6->fThisElement->fExternalElement != false)))) {
      XMLValidator::emitError((this->super_XMLScanner).fValidator,NoWSForStandalone);
    }
    if ((XVar4 == L']') &&
       (bVar3 = XMLReader::skippedString((this->super_XMLScanner).fReaderMgr.fCurReader,L"]>"),
       bVar3)) {
      if (bVar2) {
        XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
      }
      if (this->fGrammarType == SchemaGrammarType) {
        XVar10 = this_04->fIndex;
        value = this_04->fBuffer;
        value[XVar10] = L'\0';
        this_03 = (SchemaValidator *)(this->super_XMLScanner).fValidator;
        dV = this_03->fCurrentDatatypeValidator;
        if ((dV != (DatatypeValidator *)0x0) && (dV->fWhiteSpace != 0)) {
          SchemaValidator::normalizeWhiteSpace
                    (this_03,dV,value,&(this->super_XMLScanner).fWSNormalizeBuf,false);
          XVar10 = (this->super_XMLScanner).fWSNormalizeBuf.fIndex;
          value = (this->super_XMLScanner).fWSNormalizeBuf.fBuffer;
          value[XVar10] = L'\0';
          if (((this->super_XMLScanner).fNormalizeData == true) &&
             ((this->super_XMLScanner).fValidate == true)) {
            this_04->fIndex = 0;
            XMLBuffer::append(this_04,value);
          }
        }
        if (((this->super_XMLScanner).fValidate == true) &&
           (XMLBuffer::append((XMLBuffer *)&(this->super_XMLScanner).fValidator[2].fErrorReporter,
                              value), local_74 != 2)) {
          XMLValidator::emitError((this->super_XMLScanner).fValidator,NoCharDataInCM);
        }
        if (((((this->super_XMLScanner).fValidate == true) &&
             ((this->super_XMLScanner).fIdentityConstraintChecking == true)) &&
            (this->fICHandler != (IdentityConstraintHandler *)0x0)) &&
           (this->fICHandler->fMatcherStack->fMatchersCount != 0)) {
          XMLBuffer::append(&this->fContent,value,XVar10);
        }
      }
      else if ((local_74 != 2) && ((this->super_XMLScanner).fValidate != false)) {
        XMLValidator::emitError((this->super_XMLScanner).fValidator,NoCharDataInCM);
      }
      pXVar1 = (this->super_XMLScanner).fDocHandler;
      if (pXVar1 != (XMLDocumentHandler *)0x0) {
        this_04->fBuffer[this_04->fIndex] = L'\0';
        (*pXVar1->_vptr_XMLDocumentHandler[2])();
      }
      bVar3 = false;
    }
    else {
      if (!bVar9) {
        if ((toFormat & 0xfc00) == 0xdc00) {
          toEmit = Unexpected2ndSurrogateChar;
          if (!bVar2) {
LAB_002b1959:
            XMLScanner::emitError(&this->super_XMLScanner,toEmit);
          }
        }
        else {
          if ((toFormat & 0xfc00) == 0xd800) {
            if (bVar2) {
              XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
            }
            else {
              bVar2 = true;
            }
            goto LAB_002b1a0c;
          }
          toEmit = Expected2ndSurrogateChar;
          if (bVar2) goto LAB_002b1959;
          if ((((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[toFormat] & 0x40)
              == 0) {
            XMLString::binToText(toFormat,local_48,8,0x10,(this->super_XMLScanner).fMemoryManager);
            XMLScanner::emitError
                      (&this->super_XMLScanner,InvalidCharacter,local_48,(XMLCh *)0x0,(XMLCh *)0x0,
                       (XMLCh *)0x0);
            bVar9 = true;
          }
        }
        bVar2 = false;
      }
LAB_002b1a0c:
      if (this_04->fIndex == this_04->fCapacity) {
        XMLBuffer::ensureCapacity(this_04,1);
      }
      XVar10 = this_04->fIndex;
      this_04->fIndex = XVar10 + 1;
      this_04->fBuffer[XVar10] = XVar4;
      bVar3 = true;
    }
    if (!bVar3) {
      XMLBufferMgr::releaseBuffer(this_01,this_04);
      return;
    }
  } while( true );
}

Assistant:

void IGXMLScanner::scanCDSection()
{
    static const XMLCh CDataClose[] =
    {
            chCloseSquare, chCloseAngle, chNull
    };

    //  The next character should be the opening square bracket. If not
    //  issue an error, but then try to recover by skipping any whitespace
    //  and checking again.
    if (!fReaderMgr.skippedChar(chOpenSquare))
    {
        emitError(XMLErrs::ExpectedOpenSquareBracket);
        fReaderMgr.skipPastSpaces();

        // If we still don't find it, then give up, else keep going
        if (!fReaderMgr.skippedChar(chOpenSquare))
            return;
    }

    // Get a buffer for this
    XMLBufBid bbCData(&fBufMgr);

    //  We just scan forward until we hit the end of CDATA section sequence.
    //  CDATA is effectively a big escape mechanism so we don't treat markup
    //  characters specially here.
    bool            emittedError = false;
    bool    gotLeadingSurrogate = false;
    const ElemStack::StackElem* topElem = fElemStack.topElement();

    // Get the character data opts for the current element
    XMLElementDecl::CharDataOpts charOpts = XMLElementDecl::AllCharData;
    if(fGrammar->getGrammarType() == Grammar::SchemaGrammarType)
    {
        // And see if the current element is a 'Children' style content model
        ComplexTypeInfo *currType = ((SchemaValidator*)fValidator)->getCurrentTypeInfo();
        if(currType)
        {
            SchemaElementDecl::ModelTypes modelType = (SchemaElementDecl::ModelTypes) currType->getContentType();
            if(modelType == SchemaElementDecl::Children ||
               modelType == SchemaElementDecl::ElementOnlyEmpty)
                charOpts = XMLElementDecl::SpacesOk;
            else if(modelType == SchemaElementDecl::Empty)
                charOpts = XMLElementDecl::NoCharData;
        }
    } else // DTD grammar
        charOpts = topElem->fThisElement->getCharDataOpts();

    while (true)
    {
        const XMLCh nextCh = fReaderMgr.getNextChar();

        // Watch for unexpected end of file
        if (!nextCh)
        {
            emitError(XMLErrs::UnterminatedCDATASection);
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);
        }

        if (fValidate && fStandalone && (fReaderMgr.getCurrentReader()->isWhitespace(nextCh)))
        {
            // This document is standalone; this ignorable CDATA whitespace is forbidden.
            // XML 1.0, Section 2.9
            // And see if the current element is a 'Children' style content model
            if (topElem->fThisElement->isExternal()) {

                if (charOpts == XMLElementDecl::SpacesOk) // Element Content
                {
                    // Error - standalone should have a value of "no" as whitespace detected in an
                    // element type with element content whose element declaration was external
                    fValidator->emitError(XMLValid::NoWSForStandalone);
                    if(fGrammarType == Grammar::SchemaGrammarType)
                    {
                        if (getPSVIHandler())
                        {
                            // REVISIT:
                            // PSVIElement->setValidity(PSVIItem::VALIDITY_INVALID);
                        }
                    }
                }
            }
        }

        //  If this is a close square bracket it could be our closing
        //  sequence.
        if (nextCh == chCloseSquare && fReaderMgr.skippedString(CDataClose))
        {
            //  make sure we were not expecting a trailing surrogate.
            if (gotLeadingSurrogate)
                emitError(XMLErrs::Expected2ndSurrogateChar);

            if (fGrammarType == Grammar::SchemaGrammarType) {

                XMLSize_t xsLen = bbCData.getLen();
                const XMLCh* xsNormalized = bbCData.getRawBuffer();
                DatatypeValidator* tempDV = ((SchemaValidator*) fValidator)->getCurrentDatatypeValidator();
                if (tempDV && tempDV->getWSFacet() != DatatypeValidator::PRESERVE)
                {
                    // normalize the character according to schema whitespace facet
                    ((SchemaValidator*) fValidator)->normalizeWhiteSpace(tempDV, xsNormalized, fWSNormalizeBuf);
                    xsNormalized = fWSNormalizeBuf.getRawBuffer();
                    xsLen = fWSNormalizeBuf.getLen();
                    if (fNormalizeData && fValidate) {
                        bbCData.set(xsNormalized);
                    }
                }

                if (fValidate) {

                    // tell the schema validation about the character data for checkContent later
                    ((SchemaValidator*)fValidator)->setDatatypeBuffer(xsNormalized);

                    if (charOpts != XMLElementDecl::AllCharData)
                    {
                        // They definitely cannot handle any type of char data
                        fValidator->emitError(XMLValid::NoCharDataInCM);
                        if (getPSVIHandler())
                        {
                            // REVISIT:
                            // PSVIElement->setValidity(PSVIItem::VALIDITY_INVALID);
                        }
                    }
                }

                // call all active identity constraints
                if (toCheckIdentityConstraint() && fICHandler->getMatcherCount()) {
                    fContent.append(xsNormalized, xsLen);
                }
            }
            else {
                if (fValidate) {

                    if (charOpts != XMLElementDecl::AllCharData)
                    {
                        // They definitely cannot handle any type of char data
                        fValidator->emitError(XMLValid::NoCharDataInCM);
                    }
                }
            }

            // If we have a doc handler, call it
            if (fDocHandler)
            {
                fDocHandler->docCharacters(
                    bbCData.getRawBuffer(), bbCData.getLen(), true
                );
            }

            // And we are done
            break;
        }

        //  Make sure its a valid character. But if we've emitted an error
        //  already, don't bother with the overhead since we've already told
        //  them about it.
        if (!emittedError)
        {
            // Deal with surrogate pairs
            if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
            {
                //  Its a leading surrogate. If we already got one, then
                //  issue an error, else set leading flag to make sure that
                //  we look for a trailing next time.
                if (gotLeadingSurrogate)
                    emitError(XMLErrs::Expected2ndSurrogateChar);
                else
                    gotLeadingSurrogate = true;
            }
            else
            {
                //  If its a trailing surrogate, make sure that we are
                //  prepared for that. Else, its just a regular char so make
                //  sure that we were not expected a trailing surrogate.
                if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
                {
                    // Its trailing, so make sure we were expecting it
                    if (!gotLeadingSurrogate)
                        emitError(XMLErrs::Unexpected2ndSurrogateChar);
                }
                else
                {
                    //  Its just a char, so make sure we were not expecting a
                    //  trailing surrogate.
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);

                    // Its got to at least be a valid XML character
                    else if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh))
                    {
                        XMLCh tmpBuf[9];
                        XMLString::binToText
                        (
                            nextCh
                            , tmpBuf
                            , 8
                            , 16
                            , fMemoryManager
                        );
                        emitError(XMLErrs::InvalidCharacter, tmpBuf);
                        emittedError = true;
                    }
                }
                gotLeadingSurrogate = false;
            }
        }

        // Add it to the buffer
        bbCData.append(nextCh);
    }
}